

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void __thiscall glu::sl::ShaderParser::assumeToken(ShaderParser *this,Token token)

{
  long *plVar1;
  undefined8 extraout_RAX;
  Archive *pAVar2;
  long *plVar3;
  ShaderParser *this_00;
  allocator<char> local_f1;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 local_d0 [96];
  size_type *local_70;
  size_type local_60 [2];
  string local_50;
  
  if (this->m_curToken != token) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unexpected token \'","");
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(this->m_curTokenStr)._M_dataplus._M_p);
    local_d0._0_8_ = *plVar1;
    pAVar2 = (Archive *)(plVar1 + 2);
    if ((Archive *)local_d0._0_8_ == pAVar2) {
      local_d0._16_8_ = pAVar2->_vptr_Archive;
      local_d0._24_8_ = plVar1[3];
      local_d0._0_8_ = (Archive *)(local_d0 + 0x10);
    }
    else {
      local_d0._16_8_ = pAVar2->_vptr_Archive;
    }
    local_d0._8_8_ = plVar1[1];
    this_00 = (ShaderParser *)local_d0;
    *plVar1 = (long)pAVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)this_00);
    local_d0._32_8_ = *plVar1;
    plVar3 = plVar1 + 2;
    if ((long *)local_d0._32_8_ == plVar3) {
      local_d0._48_8_ = *plVar3;
      local_d0._56_8_ = plVar1[3];
      local_d0._32_8_ = local_d0 + 0x30;
    }
    else {
      local_d0._48_8_ = *plVar3;
    }
    local_d0._40_8_ = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    getTokenName(this_00,token);
    plVar1 = (long *)std::__cxx11::string::append(local_d0 + 0x20);
    local_d0._64_8_ = *plVar1;
    plVar3 = plVar1 + 2;
    if ((long *)local_d0._64_8_ == plVar3) {
      local_d0._80_8_ = *plVar3;
      local_d0._88_8_ = plVar1[3];
      local_d0._64_8_ = local_d0 + 0x50;
    }
    else {
      local_d0._80_8_ = *plVar3;
    }
    local_d0._72_8_ = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append(local_d0 + 0x40);
    local_f0 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_f0 == plVar3) {
      local_e0 = *plVar3;
      lStack_d8 = plVar1[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar3;
    }
    local_e8 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)local_f0,&local_f1);
    parseError(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((undefined1 *)local_d0._64_8_ != local_d0 + 0x50) {
      operator_delete((void *)local_d0._64_8_,(ulong)(local_d0._80_8_ + 1));
    }
    if ((undefined1 *)local_d0._32_8_ != local_d0 + 0x30) {
      operator_delete((void *)local_d0._32_8_,(ulong)((long)(_func_int ***)local_d0._48_8_ + 1));
    }
    if ((Archive *)local_d0._0_8_ != (Archive *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (this->m_curToken == token) {
    return;
  }
  deAssertFail("m_curToken == token",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderLibrary.cpp"
               ,0x31d);
  return;
}

Assistant:

void ShaderParser::assumeToken (Token token)
{
	if (m_curToken != token)
		parseError((string("unexpected token '") + m_curTokenStr + "', expecting '" + getTokenName(token) + "'").c_str());
	DE_TEST_ASSERT(m_curToken == token);
}